

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigCreateClasses(Ivy_FraigMan_t *p)

{
  int *piVar1;
  size_t __size;
  Ivy_Man_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  ulong uVar6;
  uint uVar7;
  void *__s;
  Vec_Ptr_t *pVVar8;
  Ivy_Obj_t *pIVar9;
  Ivy_Obj_t **ppIVar10;
  int iVar11;
  Ivy_Obj_t *pIVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  pIVar2 = p->pManAig;
  pIVar3 = pIVar2->pConst1;
  iVar11 = (pIVar2->nCreated - pIVar2->nDeleted) / 2;
  __size = (long)iVar11 * 8 + 0x68;
  __s = malloc(__size);
  memset(__s,0,__size);
  pVVar8 = p->pManAig->vObjs;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      pIVar4 = (Ivy_Obj_t *)pVVar8->pArray[lVar15];
      if (((pIVar4 != (Ivy_Obj_t *)0x0) && (uVar7 = *(uint *)&pIVar4->field_0x8 & 0xf, uVar7 < 7))
         && ((0x62U >> uVar7 & 1) != 0)) {
        uVar7 = Ivy_NodeHash(p,pIVar4);
        if (uVar7 == 0) {
          if (0 < (long)p->nSimWords) {
            lVar13 = 0;
            do {
              if (*(int *)((long)&pIVar4->pFanout->pFanout + lVar13 * 4) != 0) goto LAB_007d58f6;
              lVar13 = lVar13 + 1;
            } while (p->nSimWords != lVar13);
          }
          ppIVar10 = &pIVar3->pNextFan1;
          if (pIVar3->pNextFan1 != (Ivy_Obj_t *)0x0) {
            ppIVar10 = &pIVar3->pNextFan0->pNextFan1;
          }
          *ppIVar10 = pIVar4;
          pIVar3->pNextFan0 = pIVar4;
          pIVar4->pNextFan0 = pIVar3;
LAB_007d59a3:
          pIVar4->pNextFan1 = (Ivy_Obj_t *)0x0;
        }
        else {
LAB_007d58f6:
          uVar6 = (ulong)uVar7 % (ulong)(iVar11 + 0xd);
          pIVar5 = *(Ivy_Obj_t **)((long)__s + uVar6 * 8);
          if (pIVar5 != (Ivy_Obj_t *)0x0) {
            pIVar12 = pIVar5;
            do {
              pIVar9 = pIVar5;
              if (p->nSimWords < 1) {
LAB_007d5944:
                pIVar5 = pIVar9;
                if (pIVar9->pNextFan1 != (Ivy_Obj_t *)0x0) {
                  pIVar5 = pIVar9->pNextFan0;
                }
                pIVar5->pNextFan1 = pIVar4;
                pIVar9->pNextFan0 = pIVar4;
                pIVar4->pNextFan0 = pIVar9;
                goto LAB_007d59a3;
              }
              uVar14 = 0;
              while (*(int *)((long)&pIVar12->pFanout->pFanout + uVar14 * 4) ==
                     *(int *)((long)&pIVar4->pFanout->pFanout + uVar14 * 4)) {
                uVar14 = uVar14 + 1;
                pIVar9 = pIVar12;
                if ((uint)p->nSimWords == uVar14) goto LAB_007d5944;
              }
              pIVar12 = pIVar12->pPrevFan0;
            } while (pIVar12 != (Ivy_Obj_t *)0x0);
          }
          pIVar4->pPrevFan0 = pIVar5;
          *(Ivy_Obj_t **)((long)__s + uVar6 * 8) = pIVar4;
        }
      }
      lVar15 = lVar15 + 1;
      pVVar8 = p->pManAig->vObjs;
    } while (lVar15 < pVVar8->nSize);
  }
  if ((p->lClasses).pHead != (Ivy_Obj_t *)0x0) {
    __assert_fail("p->lClasses.pHead == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x4bb,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
  }
  pVVar8 = p->pManAig->vObjs;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      pIVar3 = (Ivy_Obj_t *)pVVar8->pArray[lVar15];
      if ((pIVar3 != (Ivy_Obj_t *)0x0) &&
         ((pIVar3->Id == 0 ||
          ((uVar7 = *(uint *)&pIVar3->field_0x8 & 0xf, uVar7 < 7 && ((0x62U >> uVar7 & 1) != 0))))))
      {
        pIVar3->pPrevFan0 = (Ivy_Obj_t *)0x0;
        if (pIVar3->pNextFan0 == (Ivy_Obj_t *)0x0) {
          if (pIVar3->pNextFan1 != (Ivy_Obj_t *)0x0) {
            __assert_fail("Ivy_ObjClassNodeNext(pObj) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                          ,0x4c3,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
          }
        }
        else if (pIVar3->pNextFan0->pNextFan1 == (Ivy_Obj_t *)0x0) {
          pIVar3->pNextFan0 = (Ivy_Obj_t *)0x0;
          if ((p->lClasses).pHead == (Ivy_Obj_t *)0x0) {
            (p->lClasses).pHead = pIVar3;
            (p->lClasses).pTail = pIVar3;
            pIVar3->pPrevFan0 = (Ivy_Obj_t *)0x0;
            pIVar3->pPrevFan1 = (Ivy_Obj_t *)0x0;
          }
          else {
            pIVar4 = (p->lClasses).pTail;
            pIVar4->pPrevFan0 = pIVar3;
            pIVar3->pPrevFan1 = pIVar4;
            pIVar3->pPrevFan0 = (Ivy_Obj_t *)0x0;
            (p->lClasses).pTail = pIVar3;
          }
          piVar1 = &(p->lClasses).nItems;
          *piVar1 = *piVar1 + 1;
        }
      }
      lVar15 = lVar15 + 1;
      pVVar8 = p->pManAig->vObjs;
    } while (lVar15 < pVVar8->nSize);
  }
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Ivy_FraigCreateClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t ** pTable;
    Ivy_Obj_t * pObj, * pConst1, * pBin, * pEntry;
    int i, nTableSize;
    unsigned Hash;
    pConst1 = Ivy_ManConst1(p->pManAig);
    // allocate the table
    nTableSize = Ivy_ManObjNum(p->pManAig) / 2 + 13;
    pTable = ABC_ALLOC( Ivy_Obj_t *, nTableSize ); 
    memset( pTable, 0, sizeof(Ivy_Obj_t *) * nTableSize );
    // collect nodes into the table
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Hash = Ivy_NodeHash( p, pObj );
        if ( Hash == 0 && Ivy_NodeHasZeroSim( p, pObj ) )
        {
            Ivy_NodeAddToClass( pConst1, pObj );
            continue;
        }
        // add the node to the table
        pBin = pTable[Hash % nTableSize];
        Ivy_FraigForEachBinNode( pBin, pEntry )
            if ( Ivy_NodeCompareSims( p, pEntry, pObj ) )
            {
                Ivy_NodeAddToClass( pEntry, pObj );
                break;
            }
        // check if the entry was added
        if ( pEntry )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, pBin );
        pTable[Hash % nTableSize] = pObj;
    }
    // collect non-trivial classes
    assert( p->lClasses.pHead == NULL );
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsConst1(pObj) && !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, NULL );
        if ( Ivy_ObjClassNodeRepr(pObj) == NULL )
        {
            assert( Ivy_ObjClassNodeNext(pObj) == NULL );
            continue;
        }
        // recognize the head of the class
        if ( Ivy_ObjClassNodeNext( Ivy_ObjClassNodeRepr(pObj) ) != NULL )
            continue;
        // clean the class representative and add it to the list
        Ivy_ObjSetClassNodeRepr( pObj, NULL );
        Ivy_FraigAddClass( &p->lClasses, pObj );
    }
    // free the table
    ABC_FREE( pTable );
}